

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool GetRDKObjectInformation(ON_Object *object,ON_wString *xml,int archive_3dm_version)

{
  bool bVar1;
  int iVar2;
  ON_UserData *objectud;
  uchar *__p;
  pointer buffer_00;
  char *pcVar3;
  wchar_t *sWideChar;
  uint local_524;
  int num_chars;
  uint error_status;
  char *sArray;
  ON_SimpleArray<char> s;
  int len;
  undefined1 local_4f0 [4];
  int version;
  ON_Read3dmBufferArchive archive;
  uint archive_opennurbs_version_number;
  ON__UINT8 *buffer;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> p;
  ON__UINT64 sizeof_buffer;
  undefined1 local_280 [8];
  ON_BinaryArchiveBuffer arc;
  ON_Buffer buf;
  ON_UserData *ud;
  ON_UserData *rdk_ud;
  int archive_3dm_version_local;
  ON_wString *xml_local;
  ON_Object *object_local;
  
  rdk_ud._4_4_ = archive_3dm_version;
  if (archive_3dm_version == 0) {
    rdk_ud._4_4_ = ON_BinaryArchive::CurrentArchiveVersion();
  }
  ON_wString::SetLength(xml,0);
  ud = (ON_UserData *)0x0;
  objectud = ON_UserData::Cast(object);
  if (objectud == (ON_UserData *)0x0) {
    for (buf.m_reserved._4_8_ = ON_Object::FirstUserData(object);
        buf.m_reserved._4_8_ != 0 && ud == (ON_UserData *)0x0;
        buf.m_reserved._4_8_ = ON_UserData::Next((ON_UserData *)buf.m_reserved._4_8_)) {
      ud = RDKObjectUserDataHelper((ON_UserData *)buf.m_reserved._4_8_);
    }
  }
  else {
    ud = RDKObjectUserDataHelper(objectud);
  }
  if (ud == (ON_UserData *)0x0) {
    object_local._7_1_ = 0;
    goto LAB_00605655;
  }
  ON_Buffer::ON_Buffer((ON_Buffer *)&arc.m_buffer);
  ON_BinaryArchiveBuffer::ON_BinaryArchiveBuffer
            ((ON_BinaryArchiveBuffer *)local_280,write,(ON_Buffer *)&arc.m_buffer);
  (*(ud->super_ON_Object)._vptr_ON_Object[10])(ud,local_280);
  p._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       ON_Buffer::Size((ON_Buffer *)&arc.m_buffer);
  __p = (uchar *)operator_new__((ulong)p._M_t.
                                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&buffer,__p);
  buffer_00 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                        ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         &buffer);
  ON_Buffer::SeekFromStart((ON_Buffer *)&arc.m_buffer,0);
  ON_Buffer::Read((ON_Buffer *)&arc.m_buffer,
                  (ON__UINT64)
                  p._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,buffer_00);
  archive.m_reserved4._4_4_ = ON::Version();
  ON_Read3dmBufferArchive::ON_Read3dmBufferArchive
            ((ON_Read3dmBufferArchive *)local_4f0,
             (size_t)p._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,buffer_00,false,
             rdk_ud._4_4_,archive.m_reserved4._4_4_);
  len = 0;
  bVar1 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)local_4f0,&len);
  if (bVar1) {
    if (len == 1) {
      bVar1 = ON_BinaryArchive::ReadString((ON_BinaryArchive *)local_4f0,xml);
      if (bVar1) {
LAB_006055cb:
        iVar2 = ON_wString::Length(xml);
        object_local._7_1_ = 0 < iVar2;
      }
      else {
        object_local._7_1_ = 0;
      }
    }
    else {
      if (len != 2) goto LAB_006055cb;
      s.m_capacity = 0;
      bVar1 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)local_4f0,&s.m_capacity);
      if (bVar1) {
        if (s.m_capacity < 1) {
          object_local._7_1_ = 0;
        }
        else if ((ulong)p._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl <
                 (ulong)(long)(s.m_capacity + 4)) {
          object_local._7_1_ = 0;
        }
        else {
          ON_SimpleArray<char>::ON_SimpleArray((ON_SimpleArray<char> *)&sArray);
          ON_SimpleArray<char>::Reserve((ON_SimpleArray<char> *)&sArray,(long)s.m_capacity + 1);
          ON_SimpleArray<char>::SetCount((ON_SimpleArray<char> *)&sArray,s.m_capacity + 1);
          pcVar3 = ON_SimpleArray<char>::operator[]((ON_SimpleArray<char> *)&sArray,s.m_capacity);
          *pcVar3 = '\0';
          _num_chars = ON_SimpleArray<char>::Array((ON_SimpleArray<char> *)&sArray);
          if (_num_chars == (char *)0x0) {
            object_local._7_1_ = 0;
            bVar1 = true;
          }
          else {
            bVar1 = ON_BinaryArchive::ReadChar
                              ((ON_BinaryArchive *)local_4f0,(long)s.m_capacity,_num_chars);
            if (bVar1) {
              if (*_num_chars == '\0') {
                object_local._7_1_ = 0;
                bVar1 = true;
              }
              else {
                local_524 = 0;
                iVar2 = ON_ConvertUTF8ToWideChar
                                  (0,_num_chars,-1,(wchar_t *)0x0,0,&local_524,0,0,(char **)0x0);
                if ((iVar2 < 1) || (local_524 != 0)) {
                  ON_wString::SetLength(xml,0);
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                             ,0x1666,"","RDK xml object information is not a valid UTF-8 string.");
                }
                else {
                  ON_wString::SetLength(xml,(long)iVar2 + 2);
                  pcVar3 = _num_chars;
                  sWideChar = ON_wString::Array(xml);
                  ON_ConvertUTF8ToWideChar
                            (0,pcVar3,-1,sWideChar,iVar2 + 1,&local_524,0,0,(char **)0x0);
                  ON_wString::SetLength(xml,(long)iVar2);
                }
                bVar1 = false;
              }
            }
            else {
              object_local._7_1_ = 0;
              bVar1 = true;
            }
          }
          ON_SimpleArray<char>::~ON_SimpleArray((ON_SimpleArray<char> *)&sArray);
          if (!bVar1) goto LAB_006055cb;
        }
      }
      else {
        object_local._7_1_ = 0;
      }
    }
  }
  else {
    object_local._7_1_ = 0;
  }
  ON_Read3dmBufferArchive::~ON_Read3dmBufferArchive((ON_Read3dmBufferArchive *)local_4f0);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&buffer);
  ON_BinaryArchiveBuffer::~ON_BinaryArchiveBuffer((ON_BinaryArchiveBuffer *)local_280);
  ON_Buffer::~ON_Buffer((ON_Buffer *)&arc.m_buffer);
LAB_00605655:
  return (bool)(object_local._7_1_ & 1);
}

Assistant:

static bool GetRDKObjectInformation(const ON_Object& object, ON_wString& xml, int archive_3dm_version)
{
  if (0 == archive_3dm_version)
    archive_3dm_version = ON_BinaryArchive::CurrentArchiveVersion();

  xml.SetLength(0);

  const ON_UserData* rdk_ud = nullptr;
  const auto* ud = ON_UserData::Cast(&object);
  if (nullptr != ud)
  {
    rdk_ud = RDKObjectUserDataHelper(ud);
  }
  else
  {
    for (ud = object.FirstUserData(); (nullptr != ud) && (nullptr == rdk_ud); ud = ud->Next())
    {
      rdk_ud = RDKObjectUserDataHelper(ud);
    }
  }

  if (nullptr == rdk_ud)
    return false;

  ON_Buffer buf;
  ON_BinaryArchiveBuffer arc(ON::archive_mode::write, &buf);
  rdk_ud->Write(arc);

  const auto sizeof_buffer = buf.Size();

  auto p = std::unique_ptr<ON__UINT8[]>(new ON__UINT8[size_t(sizeof_buffer)]);
  ON__UINT8* buffer = p.get();
  buf.SeekFromStart(0);
  buf.Read(sizeof_buffer, buffer);

  const unsigned int archive_opennurbs_version_number = ON::Version();
  ON_Read3dmBufferArchive archive(size_t(sizeof_buffer), buffer, false, archive_3dm_version, archive_opennurbs_version_number);

  int version = 0;
  if (!archive.ReadInt(&version))
    return false;

  if (1 == version)
  {
    // Version 1 was a UTF-16 string.
    if (!archive.ReadString(xml))
      return false;
  }
  else
  if (2 == version)
  {
    // Version 2 is a UTF-8 string.
    int len = 0;
    if (!archive.ReadInt(&len))
      return false;

    if (len <= 0)
      return false;

    if (size_t(len + 4) > sizeof_buffer) // JohnC asks: What does the 4 signify?
      return false;

    ON_SimpleArray<char> s;
    s.Reserve(size_t(len) + 1);
    s.SetCount(len + 1);
    s[len] = 0;

    char* sArray = s.Array();
    if (nullptr == sArray)
      return false;

    if (!archive.ReadChar(len, sArray))
      return false;

    if (0 == sArray[0])
      return false;

    unsigned int error_status = 0;
    const int num_chars = ON_ConvertUTF8ToWideChar(false, sArray, -1, 0, 0, &error_status, 0, 0, 0);
    if ((num_chars > 0) && (0 == error_status))
    {
      xml.SetLength(size_t(num_chars) + 2);
      ON_ConvertUTF8ToWideChar(false, sArray, -1, xml.Array(), num_chars + 1, &error_status, 0, 0, 0);
      xml.SetLength(num_chars);
    }
    else
    {
      xml.SetLength(0);
      ON_ERROR("RDK xml object information is not a valid UTF-8 string.");
    }
  }

  return xml.Length() > 0;
}